

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O3

void Cnf_ComputeClauses(Aig_Man_t *p,Aig_Obj_t *pRoot,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vNodes,
                       Vec_Int_t *vMap,Vec_Int_t *vCover,Vec_Int_t *vClauses)

{
  void *pvVar1;
  ulong uVar2;
  uint Entry;
  Vec_Ptr_t *vNodes_00;
  int iVar3;
  long lVar4;
  word wVar5;
  uint uVar6;
  int *piVar7;
  long lVar8;
  char *p_00;
  uint uVar9;
  word Truth;
  word local_40;
  Vec_Ptr_t *local_38;
  
  local_38 = vNodes;
  if ((pRoot->field_0x18 & 0x10) == 0) {
    __assert_fail("pRoot->fMarkA",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                  ,0xcc,
                  "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  vClauses->nSize = 0;
  piVar7 = &pRoot->Id;
  if (vMap != (Vec_Int_t *)0x0) {
    iVar3 = *piVar7;
    if (((long)iVar3 < 0) || (vMap->nSize <= iVar3)) {
LAB_0056141d:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    piVar7 = vMap->pArray + iVar3;
  }
  iVar3 = *piVar7;
  if (iVar3 < 1) {
LAB_0056143c:
    __assert_fail("iSatVar > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                  ,0xb7,"int Cnf_ObjGetLit(Vec_Int_t *, Aig_Obj_t *, int)");
  }
  Cnf_CollectLeaves(pRoot,vLeaves,0);
  vNodes_00 = local_38;
  Cnf_CollectVolume(p,pRoot,vLeaves,local_38);
  lVar4 = (long)vNodes_00->nSize;
  if (lVar4 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
  }
  if ((Aig_Obj_t *)vNodes_00->pArray[lVar4 + -1] != pRoot) {
    __assert_fail("pRoot == Vec_PtrEntryLast(vNodes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                  ,0xd4,
                  "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  Entry = iVar3 * 2;
  lVar8 = 0;
  do {
    pvVar1 = vNodes_00->pArray[lVar8];
    p_00 = *(char **)((long)pvVar1 + 8);
    if (((((ulong)p_00 & 1) != 0) &&
        (p_00 = (char *)((ulong)p_00 & 0xfffffffffffffffe),
        ((ulong)((Aig_Man_t *)p_00)->vCos & 0x10) == 0)) ||
       ((uVar2 = *(ulong *)((long)pvVar1 + 0x10), (uVar2 & 1) != 0 &&
        ((*(byte *)((uVar2 & 0xfffffffffffffffe) + 0x18) & 0x10) == 0)))) {
      if (vNodes_00->nSize != (int)lVar8) {
        if (6 < vLeaves->nSize) {
          p_00 = "FastCnfGeneration:  Internal error!!!";
          puts("FastCnfGeneration:  Internal error!!!");
          if (6 < vLeaves->nSize) {
            __assert_fail("Vec_PtrSize(vLeaves) <= 6",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                          ,0xf0,
                          "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
        }
        wVar5 = Cnf_CutDeriveTruth((Aig_Man_t *)p_00,vLeaves,vNodes_00);
        local_40 = wVar5;
        if (wVar5 + 1 < 2) {
          Vec_IntPush(vClauses,0);
          Vec_IntPush(vClauses,Entry | wVar5 == 0);
          return;
        }
        iVar3 = Kit_TruthIsop((uint *)&local_40,vLeaves->nSize,vCover,0);
        if (iVar3 < 0) {
          __assert_fail("RetValue >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                        ,0xfb,
                        "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        if (vCover->nSize < 1) {
          iVar3 = vLeaves->nSize;
        }
        else {
          lVar4 = 0;
          do {
            uVar9 = vCover->pArray[lVar4];
            Vec_IntPush(vClauses,0);
            Vec_IntPush(vClauses,Entry);
            iVar3 = vLeaves->nSize;
            if (0 < iVar3) {
              lVar8 = 0;
              do {
                uVar6 = uVar9 & 3;
                if (uVar6 != 0) {
                  if (uVar6 == 3) {
                    __assert_fail("(Cube & 3) != 3",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                                  ,0x105,
                                  "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                                 );
                  }
                  piVar7 = (int *)((long)vLeaves->pArray[lVar8] + 0x24);
                  if (vMap != (Vec_Int_t *)0x0) {
                    iVar3 = *piVar7;
                    if (((long)iVar3 < 0) || (vMap->nSize <= iVar3)) goto LAB_0056141d;
                    piVar7 = vMap->pArray + iVar3;
                  }
                  if (*piVar7 < 1) goto LAB_0056143c;
                  Vec_IntPush(vClauses,(uint)(uVar6 != 1) + *piVar7 * 2);
                  iVar3 = vLeaves->nSize;
                }
                lVar8 = lVar8 + 1;
                uVar9 = (int)uVar9 >> 2;
              } while (lVar8 < iVar3);
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < vCover->nSize);
        }
        local_40 = ~local_40;
        iVar3 = Kit_TruthIsop((uint *)&local_40,iVar3,vCover,0);
        if (iVar3 < 0) {
          __assert_fail("RetValue >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                        ,0x10d,
                        "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        if (vCover->nSize < 1) {
          return;
        }
        lVar4 = 0;
        do {
          uVar9 = vCover->pArray[lVar4];
          Vec_IntPush(vClauses,0);
          Vec_IntPush(vClauses,Entry | 1);
          iVar3 = vLeaves->nSize;
          if (0 < iVar3) {
            lVar8 = 0;
            do {
              uVar6 = uVar9 & 3;
              if (uVar6 != 0) {
                if (uVar6 == 3) {
                  __assert_fail("(Cube & 3) != 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                                ,0x116,
                                "void Cnf_ComputeClauses(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                               );
                }
                piVar7 = (int *)((long)vLeaves->pArray[lVar8] + 0x24);
                if (vMap != (Vec_Int_t *)0x0) {
                  iVar3 = *piVar7;
                  if (((long)iVar3 < 0) || (vMap->nSize <= iVar3)) goto LAB_0056141d;
                  piVar7 = vMap->pArray + iVar3;
                }
                if (*piVar7 < 1) goto LAB_0056143c;
                Vec_IntPush(vClauses,(uint)(uVar6 != 1) + *piVar7 * 2);
                iVar3 = vLeaves->nSize;
              }
              lVar8 = lVar8 + 1;
              uVar9 = (int)uVar9 >> 2;
            } while (lVar8 < iVar3);
          }
          lVar4 = lVar4 + 1;
          if (vCover->nSize <= lVar4) {
            return;
          }
        } while( true );
      }
      break;
    }
    lVar8 = lVar8 + 1;
  } while (lVar4 != lVar8);
  Cnf_CollectLeaves(pRoot,vLeaves,1);
  Vec_IntPush(vClauses,0);
  Vec_IntPush(vClauses,Entry);
  if (0 < vLeaves->nSize) {
    lVar4 = 0;
    do {
      piVar7 = (int *)(((ulong)vLeaves->pArray[lVar4] & 0xfffffffffffffffe) + 0x24);
      if (vMap != (Vec_Int_t *)0x0) {
        iVar3 = *piVar7;
        if (((long)iVar3 < 0) || (vMap->nSize <= iVar3)) goto LAB_0056141d;
        piVar7 = vMap->pArray + iVar3;
      }
      if (*piVar7 < 1) goto LAB_0056143c;
      Vec_IntPush(vClauses,((uint)vLeaves->pArray[lVar4] & 1) + *piVar7 * 2 ^ 1);
      lVar4 = lVar4 + 1;
    } while (lVar4 < vLeaves->nSize);
    if (0 < vLeaves->nSize) {
      lVar4 = 0;
      do {
        pvVar1 = vLeaves->pArray[lVar4];
        Vec_IntPush(vClauses,0);
        Vec_IntPush(vClauses,Entry | 1);
        piVar7 = (int *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 0x24);
        if (vMap != (Vec_Int_t *)0x0) {
          iVar3 = *piVar7;
          if (((long)iVar3 < 0) || (vMap->nSize <= iVar3)) goto LAB_0056141d;
          piVar7 = vMap->pArray + iVar3;
        }
        if (*piVar7 < 1) goto LAB_0056143c;
        Vec_IntPush(vClauses,((uint)pvVar1 & 1) + *piVar7 * 2);
        lVar4 = lVar4 + 1;
      } while (lVar4 < vLeaves->nSize);
    }
  }
  return;
}

Assistant:

void Cnf_ComputeClauses( Aig_Man_t * p, Aig_Obj_t * pRoot, 
    Vec_Ptr_t * vLeaves, Vec_Ptr_t * vNodes, Vec_Int_t * vMap, Vec_Int_t * vCover, Vec_Int_t * vClauses )
{
    Aig_Obj_t * pLeaf;
    int c, k, Cube, OutLit, RetValue;
    word Truth;
    assert( pRoot->fMarkA );

    Vec_IntClear( vClauses );

    OutLit = Cnf_ObjGetLit( vMap, pRoot, 0 );
    // detect cone
    Cnf_CollectLeaves( pRoot, vLeaves, 0 );
    Cnf_CollectVolume( p, pRoot, vLeaves, vNodes );
    assert( pRoot == Vec_PtrEntryLast(vNodes) );
    // check if this is an AND-gate
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pLeaf, k )
    {
        if ( Aig_ObjFaninC0(pLeaf) && !Aig_ObjFanin0(pLeaf)->fMarkA )
            break;
        if ( Aig_ObjFaninC1(pLeaf) && !Aig_ObjFanin1(pLeaf)->fMarkA )
            break;
    }
    if ( k == Vec_PtrSize(vNodes) )
    {
        Cnf_CollectLeaves( pRoot, vLeaves, 1 );
        // write big clause
        Vec_IntPush( vClauses, 0 );
        Vec_IntPush( vClauses, OutLit );
        Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pLeaf, k )
            Vec_IntPush( vClauses, Cnf_ObjGetLit(vMap, Aig_Regular(pLeaf), !Aig_IsComplement(pLeaf)) );
        // write small clauses
        Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pLeaf, k )
        {
            Vec_IntPush( vClauses, 0 );
            Vec_IntPush( vClauses, OutLit ^ 1 );
            Vec_IntPush( vClauses, Cnf_ObjGetLit(vMap, Aig_Regular(pLeaf), Aig_IsComplement(pLeaf)) );
        }
        return;
    }
    if ( Vec_PtrSize(vLeaves) > 6 )
        printf( "FastCnfGeneration:  Internal error!!!\n" );
    assert( Vec_PtrSize(vLeaves) <= 6 );

    Truth = Cnf_CutDeriveTruth( p, vLeaves, vNodes );
    if ( Truth == 0 || Truth == ~(word)0 )
    {
        Vec_IntPush( vClauses, 0 );
        Vec_IntPush( vClauses, (Truth == 0) ? (OutLit ^ 1) : OutLit );
        return;
    }

    RetValue = Kit_TruthIsop( (unsigned *)&Truth, Vec_PtrSize(vLeaves), vCover, 0 );
    assert( RetValue >= 0 );

    Vec_IntForEachEntry( vCover, Cube, c )
    {
        Vec_IntPush( vClauses, 0 );
        Vec_IntPush( vClauses, OutLit );
        for ( k = 0; k < Vec_PtrSize(vLeaves); k++, Cube >>= 2 )
        {
            if ( (Cube & 3) == 0 )
                continue;
            assert( (Cube & 3) != 3 );
            Vec_IntPush( vClauses, Cnf_ObjGetLit(vMap, (Aig_Obj_t *)Vec_PtrEntry(vLeaves,k), (Cube&3)!=1) );
        }
    }

    Truth = ~Truth;

    RetValue = Kit_TruthIsop( (unsigned *)&Truth, Vec_PtrSize(vLeaves), vCover, 0 );
    assert( RetValue >= 0 );
    Vec_IntForEachEntry( vCover, Cube, c )
    {
        Vec_IntPush( vClauses, 0 );
        Vec_IntPush( vClauses, OutLit ^ 1 );
        for ( k = 0; k < Vec_PtrSize(vLeaves); k++, Cube >>= 2 )
        {
            if ( (Cube & 3) == 0 )
                continue;
            assert( (Cube & 3) != 3 );
            Vec_IntPush( vClauses, Cnf_ObjGetLit(vMap, (Aig_Obj_t *)Vec_PtrEntry(vLeaves,k), (Cube&3)!=1) );
        }
    }
}